

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O2

void __thiscall
ktx::Reporter::
fatal_usage<char_const*const&,std::__cxx11::string_const&,char_const*&,std::__cxx11::string_const&>
          (Reporter *this,char **args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,char **args_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3)

{
  ostream *os;
  char *pcVar1;
  undefined8 *puVar2;
  format_string<std::__cxx11::basic_string<char>_&> fmt;
  format_string<const_std::__cxx11::basic_string<char>_&,_const_char_*&,_const_std::__cxx11::basic_string<char>_&>
  fmt_00;
  format_string<std::__cxx11::basic_string<char>_&> fmt_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2_00;
  
  args_2_00 = args_3;
  pcVar1 = (char *)std::char_traits<char>::length("{} fatal: ");
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = pcVar1;
  ::fmt::v10::print<std::__cxx11::string&>((v10 *)&std::cerr,(ostream *)"{} fatal: ",fmt,args_3);
  os = (ostream *)*args;
  pcVar1 = (char *)std::char_traits<char>::length((char_type *)os);
  fmt_00.str_.size_ = (size_t)args_1;
  fmt_00.str_.data_ = pcVar1;
  ::fmt::v10::print<std::__cxx11::string_const&,char_const*&,std::__cxx11::string_const&>
            ((v10 *)&std::cerr,os,fmt_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_2,
             (char **)args_2_00,args_2_00);
  pcVar1 = (char *)std::char_traits<char>::length(" See \'{} --help\'.\n");
  fmt_01.str_.size_ = (size_t)this;
  fmt_01.str_.data_ = pcVar1;
  ::fmt::v10::print<std::__cxx11::string&>
            ((v10 *)&std::cerr,(ostream *)" See \'{} --help\'.\n",fmt_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_2);
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = &PTR__exception_00240758;
  *(undefined4 *)(puVar2 + 1) = 1;
  __cxa_throw(puVar2,&FatalError::typeinfo,std::exception::~exception);
}

Assistant:

void fatal_usage(Args&&... args) {
        fmt::print(std::cerr, "{} fatal: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, " See '{} --help'.\n", commandName);
        throw FatalError(rc::INVALID_ARGUMENTS);
    }